

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall AllFloatsWriteTest::RunShard(AllFloatsWriteTest *this,int shard)

{
  uint uVar1;
  uint uVar2;
  char *message;
  uint local_c8;
  uint32_t them_bits;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  char *endptr;
  char buffer [100];
  
  uVar2 = 0xffffffff;
  local_c8 = 0;
  uVar1 = shard;
  do {
    if (uVar1 < local_c8) {
      if (shard == 0) {
        local_c8 = uVar1;
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
    local_c8 = uVar1;
    if ((shard == 0) && (uVar1 >> 0x18 != uVar2)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)uVar1,
             (ulong)(uint)(int)(((double)uVar1 * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar2 = uVar1 >> 0x18;
    }
    if ((~local_c8 & 0x7f800000) != 0) {
      wabt::WriteFloatHex(buffer,100,local_c8);
      them_bits = (uint32_t)strtof(buffer,&endptr);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"bits","them_bits",&local_c8,&them_bits);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0x87,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_b0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    uVar1 = (this->super_ThreadedTest).num_threads_ + local_c8;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      WriteFloatHex(buffer, sizeof(buffer), bits);

      char* endptr;
      float them_float = strtof(buffer, &endptr);
      uint32_t them_bits = bit_cast<uint32_t>(them_float);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }